

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodOptions::~MethodOptions(MethodOptions *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (puVar2 == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
                 ,0x22f3);
      other = internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: GetArenaForAllocation() == nullptr: ");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
    if ((this_00->ptr_ & 1) != 0) {
      internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    }
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
            (&this->uninterpreted_option_);
  internal::ExtensionSet::~ExtensionSet(&this->_extensions_);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MessageLite_004e16b0;
  internal::InternalMetadata::~InternalMetadata(this_00);
  return;
}

Assistant:

MethodOptions::~MethodOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.MethodOptions)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}